

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodemb.c
# Opt level: O0

void av1_dropout_qcoeff_num
               (MACROBLOCK *mb,int plane,int block,TX_SIZE tx_size,TX_TYPE tx_type,
               int dropout_num_before,int dropout_num_after)

{
  long lVar1;
  uint8_t uVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  SCAN_ORDER *pSVar7;
  TX_SIZE in_CL;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  int in_R9D;
  int j;
  int scan_idx;
  int i;
  int eob;
  int idx;
  int count_nonzeros;
  int count_zeros_after;
  int count_zeros_before;
  SCAN_ORDER *scan_order;
  int max_eob;
  tran_low_t *dqcoeff;
  tran_low_t *qcoeff;
  macroblock_plane *p;
  int local_64;
  int local_60;
  int local_58;
  uint eob_00;
  int iVar8;
  int iVar9;
  int iVar10;
  
  lVar5 = in_RDI + (long)in_ESI * 0x88;
  lVar6 = *(long *)(lVar5 + 0x10) + (long)(in_EDX << 4) * 4;
  lVar1 = *(long *)(lVar5 + 8);
  iVar3 = av1_get_max_eob(in_CL);
  pSVar7 = get_scan('\0','\0');
  if (((*(short *)(*(long *)(lVar5 + 0x20) + (long)in_EDX * 2) != 0) &&
      (in_R9D < (int)(uint)*(ushort *)(*(long *)(lVar5 + 0x20) + (long)in_EDX * 2))) &&
     (in_R9D + j < iVar3)) {
    iVar10 = 0;
    iVar9 = 0;
    iVar8 = 0;
    local_64 = -1;
    eob_00 = 0;
    for (local_58 = 0; local_58 < (int)(uint)*(ushort *)(*(long *)(lVar5 + 0x20) + (long)in_EDX * 2)
        ; local_58 = local_58 + 1) {
      iVar4 = *(int *)(lVar6 + (long)(int)pSVar7->scan[local_58] * 4);
      if (iVar4 < 1) {
        iVar4 = -iVar4;
      }
      if (iVar4 < 3) {
        if (*(int *)(lVar6 + (long)(int)pSVar7->scan[local_58] * 4) == 0) {
          if (local_64 == -1) {
            iVar10 = iVar10 + 1;
          }
          else {
            iVar9 = iVar9 + 1;
          }
        }
        else if (iVar10 < in_R9D) {
          iVar10 = 0;
          eob_00 = local_58 + 1;
        }
        else {
          if (local_64 == -1) {
            local_64 = local_58;
          }
          iVar8 = iVar8 + 1;
        }
      }
      else {
        iVar10 = 0;
        iVar9 = 0;
        local_64 = -1;
        eob_00 = local_58 + 1;
      }
      if (2 < iVar8) {
        iVar10 = 0;
        iVar9 = 0;
        iVar8 = 0;
        local_64 = -1;
        eob_00 = local_58 + 1;
      }
      if ((local_64 != -1) &&
         (local_58 == *(ushort *)(*(long *)(lVar5 + 0x20) + (long)in_EDX * 2) - 1)) {
        iVar9 = (iVar3 - (uint)*(ushort *)(*(long *)(lVar5 + 0x20) + (long)in_EDX * 2)) + iVar9;
      }
      local_60 = local_64;
      if (iVar9 < j) {
        if (local_58 == *(ushort *)(*(long *)(lVar5 + 0x20) + (long)in_EDX * 2) - 1) {
          eob_00 = local_58 + 1;
        }
      }
      else {
        for (; local_60 <= local_58; local_60 = local_60 + 1) {
          *(undefined4 *)(lVar6 + (long)pSVar7->scan[local_60] * 4) = 0;
          *(undefined4 *)(lVar1 + (long)(in_EDX << 4) * 4 + (long)pSVar7->scan[local_60] * 4) = 0;
        }
        iVar10 = (local_58 - local_64) + 1 + iVar10;
        iVar9 = 0;
        iVar8 = 0;
      }
    }
    if (eob_00 != *(ushort *)(*(long *)(lVar5 + 0x20) + (long)in_EDX * 2)) {
      *(short *)(*(long *)(lVar5 + 0x20) + (long)in_EDX * 2) = (short)eob_00;
      uVar2 = av1_get_txb_entropy_context
                        ((tran_low_t *)CONCAT44(iVar10,iVar9),(SCAN_ORDER *)CONCAT44(iVar8,local_64)
                         ,eob_00);
      *(uint8_t *)(*(long *)(lVar5 + 0x28) + (long)in_EDX) = uVar2;
    }
  }
  return;
}

Assistant:

void av1_dropout_qcoeff_num(MACROBLOCK *mb, int plane, int block,
                            TX_SIZE tx_size, TX_TYPE tx_type,
                            int dropout_num_before, int dropout_num_after) {
  const struct macroblock_plane *const p = &mb->plane[plane];
  tran_low_t *const qcoeff = p->qcoeff + BLOCK_OFFSET(block);
  tran_low_t *const dqcoeff = p->dqcoeff + BLOCK_OFFSET(block);
  const int max_eob = av1_get_max_eob(tx_size);
  const SCAN_ORDER *const scan_order = get_scan(tx_size, tx_type);

  // Early return if there are not enough non-zero coefficients.
  if (p->eobs[block] == 0 || p->eobs[block] <= dropout_num_before ||
      max_eob <= dropout_num_before + dropout_num_after) {
    return;
  }

  int count_zeros_before = 0;
  int count_zeros_after = 0;
  int count_nonzeros = 0;
  // Index of the first non-zero coefficient after sufficient number of
  // continuous zeros. If equals to `-1`, it means number of leading zeros
  // hasn't reach `dropout_num_before`.
  int idx = -1;
  int eob = 0;  // New end of block.

  for (int i = 0; i < p->eobs[block]; ++i) {
    const int scan_idx = scan_order->scan[i];
    if (abs(qcoeff[scan_idx]) > DROPOUT_COEFF_MAX) {
      // Keep large coefficients.
      count_zeros_before = 0;
      count_zeros_after = 0;
      idx = -1;
      eob = i + 1;
    } else if (qcoeff[scan_idx] == 0) {  // Count zeros.
      if (idx == -1) {
        ++count_zeros_before;
      } else {
        ++count_zeros_after;
      }
    } else {  // Count non-zeros.
      if (count_zeros_before >= dropout_num_before) {
        idx = (idx == -1) ? i : idx;
        ++count_nonzeros;
      } else {
        count_zeros_before = 0;
        eob = i + 1;
      }
    }

    // Handle continuity.
    if (count_nonzeros > DROPOUT_CONTINUITY_MAX) {
      count_zeros_before = 0;
      count_zeros_after = 0;
      count_nonzeros = 0;
      idx = -1;
      eob = i + 1;
    }

    // Handle the trailing zeros after original end of block.
    if (idx != -1 && i == p->eobs[block] - 1) {
      count_zeros_after += (max_eob - p->eobs[block]);
    }

    // Set redundant coefficients to zeros if needed.
    if (count_zeros_after >= dropout_num_after) {
      for (int j = idx; j <= i; ++j) {
        qcoeff[scan_order->scan[j]] = 0;
        dqcoeff[scan_order->scan[j]] = 0;
      }
      count_zeros_before += (i - idx + 1);
      count_zeros_after = 0;
      count_nonzeros = 0;
    } else if (i == p->eobs[block] - 1) {
      eob = i + 1;
    }
  }

  if (eob != p->eobs[block]) {
    p->eobs[block] = eob;
    p->txb_entropy_ctx[block] =
        av1_get_txb_entropy_context(qcoeff, scan_order, eob);
  }
}